

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

void HU4(uint8_t *dst,uint8_t *top)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int L;
  int K;
  int J;
  int I;
  uint8_t *top_local;
  uint8_t *dst_local;
  
  bVar1 = top[-2];
  uVar4 = (uint)top[-3];
  uVar5 = (uint)top[-4];
  bVar2 = top[-5];
  uVar6 = (uint)bVar2;
  *dst = (uint8_t)((int)(bVar1 + uVar4 + 1) >> 1);
  uVar3 = (uint8_t)((int)(uVar4 + uVar5 + 1) >> 1);
  dst[0x20] = uVar3;
  dst[2] = uVar3;
  uVar3 = (uint8_t)((int)(uVar5 + uVar6 + 1) >> 1);
  dst[0x40] = uVar3;
  dst[0x22] = uVar3;
  dst[1] = (uint8_t)((int)((uint)bVar1 + uVar4 * 2 + uVar5 + 2) >> 2);
  uVar3 = (uint8_t)((int)(uVar4 + uVar5 * 2 + uVar6 + 2) >> 2);
  dst[0x21] = uVar3;
  dst[3] = uVar3;
  uVar3 = (uint8_t)((int)(uVar5 + uVar6 * 2 + uVar6 + 2) >> 2);
  dst[0x41] = uVar3;
  dst[0x23] = uVar3;
  dst[99] = bVar2;
  dst[0x62] = bVar2;
  dst[0x61] = bVar2;
  dst[0x60] = bVar2;
  dst[0x42] = bVar2;
  dst[0x43] = bVar2;
  return;
}

Assistant:

static void HU4(uint8_t* dst, const uint8_t* top) {
  const int I = top[-2];
  const int J = top[-3];
  const int K = top[-4];
  const int L = top[-5];
  DST(0, 0) =             AVG2(I, J);
  DST(2, 0) = DST(0, 1) = AVG2(J, K);
  DST(2, 1) = DST(0, 2) = AVG2(K, L);
  DST(1, 0) =             AVG3(I, J, K);
  DST(3, 0) = DST(1, 1) = AVG3(J, K, L);
  DST(3, 1) = DST(1, 2) = AVG3(K, L, L);
  DST(3, 2) = DST(2, 2) =
  DST(0, 3) = DST(1, 3) = DST(2, 3) = DST(3, 3) = L;
}